

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void divsufsortxx::substring::
     sort<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (char *T,iterator PA,iterator first,iterator last,iterator buf,value_type bufsize,
               value_type depth,value_type size,bool lastsuffix,int blocksize)

{
  iterator last_00;
  iterator middle;
  iterator middle_00;
  iterator middle_01;
  iterator last_01;
  iterator last_02;
  iterator buf_00;
  int iVar1;
  int iVar2;
  pos_type pVar3;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  BitmapArray<long> *pBVar4;
  long lVar5;
  ulong uVar6;
  pos_type pVar7;
  ulong uVar8;
  long lVar9;
  pos_type pVar10;
  pos_type pVar11;
  iterator p1;
  iterator p2;
  iterator first_00;
  iterator first_01;
  iterator first_02;
  iterator first_03;
  iterator first_04;
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
  stack2;
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
  stack1;
  value_reference local_160;
  value_reference local_150;
  BitmapArray<long> *local_140;
  pos_type pStack_138;
  BitmapArray<long> *local_130;
  pos_type pStack_128;
  BitmapArray<long> *local_120;
  pos_type pStack_118;
  BitmapArray<long> *local_110;
  pos_type pStack_108;
  BitmapArray<long> *local_100;
  pos_type pStack_f8;
  BitmapArray<long> *local_f0;
  pos_type pStack_e8;
  BitmapArray<long> *local_e0;
  pos_type pStack_d8;
  _Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
  local_d0;
  _Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>
  local_80;
  
  pBVar4 = first.array_;
  p1.array_ = PA.array_;
  std::
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>>
  ::
  stack<std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>,void>
            ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
              *)&local_80);
  std::
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>
  ::
  stack<std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>,void>
            ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
              *)&local_d0);
  pVar3 = (ulong)lastsuffix + first.pos_;
  lVar5 = (long)blocksize;
  uVar8 = 0;
  pVar10 = pVar3;
  while (lVar5 < (long)(last.pos_ - pVar10)) {
    pVar11 = pVar10 + lVar5;
    last_00.pos_ = pVar11;
    last_00.array_ = pBVar4;
    first_00.pos_ = pVar10;
    first_00.array_ = pBVar4;
    local_e0 = pBVar4;
    pStack_d8 = pVar11;
    mintrosort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>>,char*,bitmap::BitmapArray<long>::iterator>
              ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                *)&local_80,T,PA,first_00,last_00,depth);
    uVar6 = uVar8;
    lVar9 = lVar5;
    if ((long)(last.pos_ - pVar11) < bufsize) {
      for (; (uVar6 & 1) != 0; uVar6 = uVar6 >> 1) {
        pVar7 = pVar10 - lVar9;
        pStack_128 = pVar10 + lVar9;
        middle.pos_ = pVar10;
        middle.array_ = pBVar4;
        last_01.pos_ = pStack_128;
        last_01.array_ = pBVar4;
        first_01.pos_ = pVar7;
        first_01.array_ = pBVar4;
        local_130 = pBVar4;
        local_120 = pBVar4;
        pStack_118 = pVar10;
        merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)&local_d0,T,PA,first_01,middle,last_01,buf,bufsize,depth);
        lVar9 = lVar9 * 2;
        pVar10 = pVar7;
      }
    }
    else {
      for (; (uVar6 & 1) != 0; uVar6 = uVar6 >> 1) {
        pVar7 = pVar10 - lVar9;
        pStack_f8 = pVar10 + lVar9;
        middle_00.pos_ = pVar10;
        middle_00.array_ = pBVar4;
        last_02.pos_ = pStack_f8;
        last_02.array_ = pBVar4;
        buf_00.pos_ = pVar11;
        buf_00.array_ = pBVar4;
        first_02.pos_ = pVar7;
        first_02.array_ = pBVar4;
        local_110 = pBVar4;
        pStack_108 = pVar11;
        local_100 = pBVar4;
        local_f0 = pBVar4;
        pStack_e8 = pVar10;
        merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)&local_d0,T,PA,first_02,middle_00,last_02,buf_00,last.pos_ - pVar11,depth);
        lVar9 = lVar9 * 2;
        pVar10 = pVar7;
      }
    }
    uVar8 = uVar8 + 1;
    pVar10 = pVar11;
  }
  first_03.pos_ = pVar10;
  first_03.array_ = pBVar4;
  mintrosort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>>,char*,bitmap::BitmapArray<long>::iterator>
            ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
              *)&local_80,T,PA,first_03,last,depth);
  for (; uVar8 != 0; uVar8 = uVar8 >> 1) {
    pVar11 = pVar10;
    if ((uVar8 & 1) != 0) {
      pVar11 = pVar10 - lVar5;
      middle_01.pos_ = pVar10;
      middle_01.array_ = pBVar4;
      first_04.pos_ = pVar11;
      first_04.array_ = pBVar4;
      local_140 = pBVar4;
      pStack_138 = pVar10;
      merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                  *)&local_d0,T,PA,first_04,middle_01,last,buf,bufsize,depth);
    }
    lVar5 = lVar5 * 2;
    pVar10 = pVar11;
  }
  if (lastsuffix) {
    iVar1 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,pVar3 - 1);
    for (; pVar3 < last.pos_; pVar3 = pVar3 + 1) {
      (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,pVar3);
      if (-1 < extraout_var_00) {
        iVar2 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,pVar3);
        p1.pos_ = CONCAT44(extraout_var,iVar1) + PA.pos_;
        p2.pos_ = CONCAT44(extraout_var_01,iVar2) + PA.pos_;
        p2.array_ = p1.array_;
        iVar2 = compare_last<char*,bitmap::BitmapArray<long>::iterator>(T,p1,p2,depth,size);
        if (iVar2 < 1) break;
      }
      local_160.pos_ = pVar3 - 1;
      local_160.array_ = pBVar4;
      local_150.array_ = pBVar4;
      local_150.pos_ = pVar3;
      bitmap::BitmapArray<long>::value_reference::operator=(&local_160,&local_150);
    }
    (*(pBVar4->super_Bitmap)._vptr_Bitmap[4])(pBVar4,pVar3 - 1,CONCAT44(extraout_var,iVar1));
  }
  std::
  _Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
  ::~_Deque_base(&local_d0);
  std::
  _Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>
  ::~_Deque_base(&local_80);
  return;
}

Assistant:

void sort(const StringIterator_type T, const SAIterator_type PA,
          SAIterator_type first, SAIterator_type last, BufIterator_type buf,
          typename std::iterator_traits<SAIterator_type>::value_type bufsize,
          typename std::iterator_traits<SAIterator_type>::value_type depth,
          typename std::iterator_traits<SAIterator_type>::value_type size,
          bool lastsuffix, int blocksize = 1024) {
  typedef typename std::iterator_traits<SAIterator_type>::value_type pos_type;
  std::stack<helper::stackinfo4<SAIterator_type, SAIterator_type, pos_type, int> > stack1;
  std::stack<
      helper::stackinfo4<SAIterator_type, SAIterator_type, SAIterator_type, int> > stack2;

  SAIterator_type a, b;
  SAIterator_type curbuf;
  pos_type i, j, k, curbufsize;

  if (lastsuffix != false) {
    ++first;
  }
  for (a = first, i = 0; blocksize < (last - a); a += blocksize, ++i) {
    mintrosort(stack1, T, PA, a, a + blocksize, depth);
    curbuf = a + blocksize;
    curbufsize = last - (a + blocksize);
    if (bufsize <= curbufsize) {
      for (b = a, k = blocksize, j = i; j & 1; b -= k, k <<= 1, j >>= 1) {
        merge(stack2, T, PA, b - k, b, b + k, curbuf, curbufsize, depth);
      }
    } else {
      for (b = a, k = blocksize, j = i; j & 1; b -= k, k <<= 1, j >>= 1) {
        merge(stack2, T, PA, b - k, b, b + k, buf, bufsize, depth);
      }
    }
  }
  mintrosort(stack1, T, PA, a, last, depth);
  for (k = blocksize; i != 0; k <<= 1, i >>= 1) {
    if (i & 1) {
      merge(stack2, T, PA, a - k, a, last, buf, bufsize, depth);
      a -= k;
    }
  }

  if (lastsuffix != false) {
    /* Insert last type B* suffix. */
    for (a = first, i = *(first - 1);
        (a < last)
            && ((*a < 0) || (0 < compare_last(T, PA + i, PA + *a, depth, size)));
        ++a) {
      *(a - 1) = *a;
    }
    *(a - 1) = i;
  }
}